

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O1

void handle_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                 cio_error err,size_t bytes_transferred)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  int iVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  
  plVar8 = (long *)((long)handler_context + 0x50);
  if (err == CIO_SUCCESS) {
    plVar6 = (long *)*plVar8;
    if (plVar6 != (long *)0x0 && plVar6 != plVar8) {
      *(long *)((long)handler_context + 0x60) = *(long *)((long)handler_context + 0x60) + -1;
      *(long *)((long)handler_context + 0x68) = *(long *)((long)handler_context + 0x68) - plVar6[3];
      plVar7 = plVar6 + 3;
      lVar1 = *plVar6;
      plVar2 = (long *)plVar6[1];
      *(long **)(lVar1 + 8) = plVar2;
      *plVar2 = lVar1;
      plVar2 = (long *)((long)handler_context + 0x70);
      uVar9 = plVar6[3];
      if (uVar9 <= bytes_transferred) {
        do {
          if (plVar2 != plVar6) {
            lVar1 = *(long *)((long)handler_context + 0x48);
            puVar3 = *(undefined8 **)(lVar1 + 8);
            *plVar6 = lVar1;
            plVar6[1] = (long)puVar3;
            *puVar3 = plVar6;
            *(long **)(lVar1 + 8) = plVar6;
            *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + 1;
            *(long *)(lVar1 + 0x18) = *(long *)(lVar1 + 0x18) + *plVar7;
          }
          plVar6 = (long *)*plVar8;
          if ((long *)*plVar8 == plVar8) {
            plVar6 = (long *)0x0;
          }
          if (plVar6 == (long *)0x0) goto LAB_0010233c;
          *(long *)((long)handler_context + 0x60) = *(long *)((long)handler_context + 0x60) + -1;
          *(long *)((long)handler_context + 0x68) =
               *(long *)((long)handler_context + 0x68) - plVar6[3];
          bytes_transferred = bytes_transferred - uVar9;
          plVar7 = plVar6 + 3;
          lVar1 = *plVar6;
          plVar4 = (long *)plVar6[1];
          *(long **)(lVar1 + 8) = plVar4;
          *plVar4 = lVar1;
          uVar9 = plVar6[3];
        } while (uVar9 <= bytes_transferred);
      }
      if (plVar2 != plVar6) {
        lVar1 = *(long *)((long)handler_context + 0x48);
        puVar3 = *(undefined8 **)(lVar1 + 8);
        *plVar6 = lVar1;
        plVar6[1] = (long)puVar3;
        *puVar3 = plVar6;
        *(long **)(lVar1 + 8) = plVar6;
        *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + 1;
        *(long *)(lVar1 + 0x18) = *(long *)(lVar1 + 0x18) + *plVar7;
      }
      lVar1 = *plVar7;
      *(size_t *)((long)handler_context + 0x80) = plVar6[2] + bytes_transferred;
      *(size_t *)((long)handler_context + 0x88) = lVar1 - bytes_transferred;
      lVar1 = *(long *)((long)handler_context + 0x50);
      *(long *)((long)handler_context + 0x70) = lVar1;
      *(long **)((long)handler_context + 0x78) = plVar8;
      *(long **)((long)handler_context + 0x50) = plVar2;
      *(long **)(lVar1 + 8) = plVar2;
      *(long *)((long)handler_context + 0x60) = *(long *)((long)handler_context + 0x60) + 1;
      *(long *)((long)handler_context + 0x68) =
           *(long *)((long)handler_context + 0x68) + *(long *)((long)handler_context + 0x88);
    }
LAB_0010233c:
    if ((long *)*plVar8 == plVar8) {
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),0);
      return;
    }
    iVar5 = (**(code **)(*handler_context + 8))(io_stream,plVar8,handle_write,handler_context);
    if (iVar5 != 0) {
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),iVar5,
                 *(code **)((long)handler_context + 0x38));
      return;
    }
  }
  else {
    handle_write_cold_1();
  }
  return;
}

Assistant:

static void handle_write(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct echo_client *client = handler_context;

	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "write error!\n");
		return;
	}

	cio_read_buffer_consume(&client->rb, client->number_of_bytes_read);
	struct cio_io_stream *stream = cio_socket_get_io_stream(&client->socket);
	stream->read_some(stream, &client->rb, handle_read, client);
}